

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

void __thiscall QMdiArea::setActiveSubWindow(QMdiArea *this,QMdiSubWindow *window)

{
  QMdiAreaPrivate *this_00;
  qsizetype qVar1;
  long in_FS_OFFSET;
  QMdiSubWindow *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiAreaPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  local_18 = window;
  if (window == (QMdiSubWindow *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      QMdiAreaPrivate::activateWindow(this_00,(QMdiSubWindow *)0x0);
      return;
    }
  }
  else {
    if ((this_00->childWindows).d.size == 0) {
      setActiveSubWindow();
    }
    else {
      qVar1 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                        (&this_00->childWindows,&local_18,0);
      if (qVar1 == -1) {
        setActiveSubWindow();
      }
      else {
        QMdiAreaPrivate::activateWindow(this_00,local_18);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QMdiArea::setActiveSubWindow(QMdiSubWindow *window)
{
    Q_D(QMdiArea);
    if (!window) {
        d->activateWindow(nullptr);
        return;
    }

    if (Q_UNLIKELY(d->childWindows.isEmpty())) {
        qWarning("QMdiArea::setActiveSubWindow: workspace is empty");
        return;
    }

    if (Q_UNLIKELY(d->childWindows.indexOf(window) == -1)) {
        qWarning("QMdiArea::setActiveSubWindow: window is not inside workspace");
        return;
    }

    d->activateWindow(window);
}